

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

ps_latlink_t * ps_lattice_popq(ps_lattice_t *dag)

{
  latlink_list_s *plVar1;
  ps_latlink_t *link;
  latlink_list_t *x;
  ps_lattice_t *dag_local;
  
  if (dag->q_head == (latlink_list_t *)0x0) {
    dag_local = (ps_lattice_t *)0x0;
  }
  else {
    dag_local = (ps_lattice_t *)dag->q_head->link;
    plVar1 = dag->q_head->next;
    __listelem_free__(dag->latlink_list_alloc,dag->q_head,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                      ,0x434);
    dag->q_head = plVar1;
    if (dag->q_head == (latlink_list_t *)0x0) {
      dag->q_tail = (latlink_list_t *)0x0;
    }
  }
  return (ps_latlink_t *)dag_local;
}

Assistant:

ps_latlink_t *
ps_lattice_popq(ps_lattice_t *dag)
{
    latlink_list_t *x;
    ps_latlink_t *link;

    if (dag->q_head == NULL)
        return NULL;
    link = dag->q_head->link;
    x = dag->q_head->next;
    listelem_free(dag->latlink_list_alloc, dag->q_head);
    dag->q_head = x;
    if (dag->q_head == NULL)
        dag->q_tail = NULL;
    return link;
}